

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::SequenceRange::serializeTo(SequenceRange *this,ASTSerializer *serializer)

{
  string_view name;
  string_view name_00;
  bool bVar1;
  ASTSerializer *in_RSI;
  size_t in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_t in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff98;
  uint value;
  ASTSerializer *this_00;
  char *in_stack_ffffffffffffffb0;
  undefined4 local_40;
  undefined8 local_38;
  
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,in_stack_ffffffffffffff98);
  name._M_str = in_stack_ffffffffffffffb0;
  name._M_len = in_RDI;
  ASTSerializer::write<unsigned_int>(this_00,name,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x9a71dc);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RSI);
    value = (uint)((ulong)in_RSI >> 0x20);
    std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x9a720b);
    name_00._M_str = in_stack_ffffffffffffffb0;
    name_00._M_len = in_RDI;
    ASTSerializer::write<unsigned_int>(this_00,name_00,value);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_stack_ffffffffffffff98
              );
    bVar2 = sv((char *)in_RSI,in_stack_ffffffffffffff88);
    ASTSerializer::write(in_RSI,local_40,local_38,bVar2._M_len);
  }
  return;
}

Assistant:

void SequenceRange::serializeTo(ASTSerializer& serializer) const {
    serializer.write("min", min);
    if (max)
        serializer.write("max", *max);
    else
        serializer.write("max", "$"sv);
}